

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_reader.cc
# Opt level: O2

bool __thiscall leveldb::log::Reader::SkipToInitialBlock(Reader *this)

{
  char *in_RAX;
  ulong uVar1;
  bool bVar2;
  uint64_t bytes;
  Status skip_status;
  Status local_28;
  
  uVar1 = this->initial_offset_ & 0xffffffffffff8000;
  bytes = uVar1 + 0x8000;
  if (((uint)this->initial_offset_ & 0x7fff) < 0x7ffb) {
    bytes = uVar1;
  }
  this->end_of_buffer_offset_ = bytes;
  bVar2 = true;
  if (bytes != 0) {
    local_28.state_ = in_RAX;
    (*this->file_->_vptr_SequentialFile[3])(&local_28,this->file_,bytes);
    if (local_28.state_ == (char *)0x0) {
      Status::~Status(&local_28);
    }
    else {
      ReportDrop(this,bytes,&local_28);
      Status::~Status(&local_28);
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool Reader::SkipToInitialBlock() {
  const size_t offset_in_block = initial_offset_ % kBlockSize;
  uint64_t block_start_location = initial_offset_ - offset_in_block;

  // Don't search a block if we'd be in the trailer
  if (offset_in_block > kBlockSize - 6) {
    block_start_location += kBlockSize;
  }

  end_of_buffer_offset_ = block_start_location;

  // Skip to start of first block that can contain the initial record
  if (block_start_location > 0) {
    Status skip_status = file_->Skip(block_start_location);
    if (!skip_status.ok()) {
      ReportDrop(block_start_location, skip_status);
      return false;
    }
  }

  return true;
}